

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_L_mult_inplace(m256v *LU,m256v *X_inout)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int rt;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (ulong)LU->n_row;
  if (0 < (long)uVar7) {
    uVar5 = LU->n_row - 2;
    uVar8 = uVar7;
    do {
      uVar7 = uVar7 - 1;
      uVar6 = (ulong)uVar5;
      uVar3 = LU->n_col;
      rt = (int)(uVar8 - 1);
      if ((long)(int)uVar3 < (long)uVar8) {
        if (0 < X_inout->n_col) {
          lVar2 = 0;
          do {
            X_inout->e[lVar2 + X_inout->rstride * uVar7] = '\0';
            lVar2 = lVar2 + 1;
          } while (lVar2 < X_inout->n_col);
          uVar3 = LU->n_col;
        }
        if (0 < (int)uVar3) {
          uVar6 = (ulong)uVar3;
          do {
            m256v_multadd_row_from
                      (X_inout,(int)(uVar6 - 1),0,LU->e[(uVar6 - 1) + LU->rstride * uVar7],X_inout,
                       rt);
            bVar1 = 1 < uVar6;
            uVar6 = uVar6 - 1;
          } while (bVar1);
        }
      }
      else {
        if (uVar8 < 2) {
          return;
        }
        uVar4 = uVar7 & 0xffffffff;
        do {
          uVar3 = (int)uVar4 - 1;
          uVar4 = (ulong)uVar3;
          m256v_multadd_row_from(X_inout,uVar3,0,LU->e[uVar6 + LU->rstride * uVar7],X_inout,rt);
          uVar6 = uVar6 - 1;
        } while (0 < (int)uVar3);
      }
      uVar5 = uVar5 - 1;
      bVar1 = 1 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}